

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall
leveldb::DBImpl::FinishCompactionOutputFile(DBImpl *this,CompactionState *compact,Iterator *input)

{
  undefined1 uVar1;
  bool bVar2;
  uint uVar3;
  Output *pOVar4;
  TableBuilder *pTVar5;
  ReadOptions *file_size;
  Iterator *pIVar6;
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  Iterator *iter;
  uint64_t current_bytes;
  uint64_t current_entries;
  uint64_t output_number;
  Status *s;
  Compaction *in_stack_fffffffffffffec8;
  Status *in_stack_fffffffffffffed0;
  Logger *info_log;
  CompactionState *in_stack_fffffffffffffed8;
  uint64_t uVar7;
  Table **tableptr;
  ReadOptions *options;
  undefined7 in_stack_ffffffffffffff40;
  TableBuilder *this_00;
  ReadOptions *pRVar8;
  undefined1 local_40 [8];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_20 [8];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == 0) {
    __assert_fail("compact != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x337,
                  "Status leveldb::DBImpl::FinishCompactionOutputFile(CompactionState *, Iterator *)"
                 );
  }
  if (*(long *)(in_RDX + 0x28) == 0) {
    __assert_fail("compact->outfile != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x338,
                  "Status leveldb::DBImpl::FinishCompactionOutputFile(CompactionState *, Iterator *)"
                 );
  }
  if (*(long *)(in_RDX + 0x30) == 0) {
    __assert_fail("compact->builder != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x339,
                  "Status leveldb::DBImpl::FinishCompactionOutputFile(CompactionState *, Iterator *)"
                 );
  }
  pOVar4 = CompactionState::current_output(in_stack_fffffffffffffed8);
  uVar7 = pOVar4->number;
  if (uVar7 != 0) {
    (**(code **)(*in_RCX + 0x50))(in_RDI);
    pTVar5 = (TableBuilder *)TableBuilder::NumEntries((TableBuilder *)in_stack_fffffffffffffec8);
    this_00 = pTVar5;
    uVar1 = Status::ok((Status *)in_stack_fffffffffffffec8);
    if ((bool)uVar1) {
      TableBuilder::Finish(this_00);
      Status::operator=((Status *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      Status::~Status((Status *)in_stack_fffffffffffffec8);
    }
    else {
      TableBuilder::Abandon((TableBuilder *)in_stack_fffffffffffffec8);
    }
    file_size = (ReadOptions *)TableBuilder::FileSize((TableBuilder *)in_stack_fffffffffffffec8);
    options = file_size;
    pRVar8 = file_size;
    pOVar4 = CompactionState::current_output(in_stack_fffffffffffffed8);
    pOVar4->file_size = (uint64_t)file_size;
    *(bool **)(in_RDX + 0x38) = &pRVar8->verify_checksums + *(long *)(in_RDX + 0x38);
    tableptr = *(Table ***)(in_RDX + 0x30);
    if (tableptr != (Table **)0x0) {
      TableBuilder::~TableBuilder((TableBuilder *)in_stack_fffffffffffffed8);
      operator_delete(tableptr,8);
    }
    *(undefined8 *)(in_RDX + 0x30) = 0;
    bVar2 = Status::ok((Status *)in_stack_fffffffffffffec8);
    if (bVar2) {
      (**(code **)(**(long **)(in_RDX + 0x28) + 0x28))(local_18);
      Status::operator=((Status *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      Status::~Status((Status *)in_stack_fffffffffffffec8);
    }
    bVar2 = Status::ok((Status *)in_stack_fffffffffffffec8);
    if (bVar2) {
      (**(code **)(**(long **)(in_RDX + 0x28) + 0x18))(local_20);
      Status::operator=((Status *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      Status::~Status((Status *)in_stack_fffffffffffffec8);
    }
    if (*(long **)(in_RDX + 0x28) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDX + 0x28) + 8))();
    }
    *(undefined8 *)(in_RDX + 0x28) = 0;
    bVar2 = Status::ok((Status *)in_stack_fffffffffffffec8);
    if ((bVar2) && (pTVar5 != (TableBuilder *)0x0)) {
      local_38 = 0;
      uStack_30 = 0;
      ReadOptions::ReadOptions((ReadOptions *)in_stack_fffffffffffffec8);
      pIVar6 = TableCache::NewIterator
                         ((TableCache *)CONCAT17(uVar1,in_stack_ffffffffffffff40),options,
                          (uint64_t)pOVar4,(uint64_t)file_size,tableptr);
      (*pIVar6->_vptr_Iterator[10])(local_40);
      Status::operator=((Status *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      Status::~Status((Status *)in_stack_fffffffffffffec8);
      if (pIVar6 != (Iterator *)0x0) {
        (*pIVar6->_vptr_Iterator[1])();
      }
      bVar2 = Status::ok((Status *)in_stack_fffffffffffffec8);
      if (bVar2) {
        info_log = *(Logger **)(in_RSI + 0x48);
        uVar3 = Compaction::level(in_stack_fffffffffffffec8);
        Log(info_log,"Generated table #%llu@%d: %lld keys, %lld bytes",uVar7,(ulong)uVar3,pTVar5,
            pRVar8);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return (Status)in_RDI;
    }
    __stack_chk_fail();
  }
  __assert_fail("output_number != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                ,0x33c,
                "Status leveldb::DBImpl::FinishCompactionOutputFile(CompactionState *, Iterator *)")
  ;
}

Assistant:

Status DBImpl::FinishCompactionOutputFile(CompactionState* compact,
                                          Iterator* input) {
  assert(compact != nullptr);
  assert(compact->outfile != nullptr);
  assert(compact->builder != nullptr);

  const uint64_t output_number = compact->current_output()->number;
  assert(output_number != 0);

  // Check for iterator errors
  Status s = input->status();
  const uint64_t current_entries = compact->builder->NumEntries();
  if (s.ok()) {
    s = compact->builder->Finish();
  } else {
    compact->builder->Abandon();
  }
  const uint64_t current_bytes = compact->builder->FileSize();
  compact->current_output()->file_size = current_bytes;
  compact->total_bytes += current_bytes;
  delete compact->builder;
  compact->builder = nullptr;

  // Finish and check for file errors
  if (s.ok()) {
    s = compact->outfile->Sync();
  }
  if (s.ok()) {
    s = compact->outfile->Close();
  }
  delete compact->outfile;
  compact->outfile = nullptr;

  if (s.ok() && current_entries > 0) {
    // Verify that the table is usable
    Iterator* iter =
        table_cache_->NewIterator(ReadOptions(), output_number, current_bytes);
    s = iter->status();
    delete iter;
    if (s.ok()) {
      Log(options_.info_log, "Generated table #%llu@%d: %lld keys, %lld bytes",
          (unsigned long long)output_number, compact->compaction->level(),
          (unsigned long long)current_entries,
          (unsigned long long)current_bytes);
    }
  }
  return s;
}